

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.hpp
# Opt level: O0

void __thiscall curlpp::FormPart::FormPart(FormPart *this,FormPart *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__FormPart_00162b78;
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 8));
  return;
}

Assistant:

class CURLPPAPI FormPart
	{
		friend class HttpPost;

	public:

		/**
		* initialize the FormPart. "name" is the name of the field.
		*/
		FormPart(const char * name);

		/**
		* initialize the FormPart. "name" is the name of the field.
		*/
		FormPart(const std::string & name);

		virtual ~FormPart();

		virtual FormPart * clone() const = 0;

	protected:

		/**
		* it will add himself to the curl_httppost * first.
		*/
		virtual void add(::curl_httppost ** first, 
			::curl_httppost ** last) = 0;

		/**
		* Contain the name of the field.
		*/
		const std::string mName;

	}